

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

ScalarFunctionSet * duckdb::SignFun::GetFunctions(void)

{
  LogicalType varargs;
  LogicalType *type;
  ScalarFunctionSet *in_RDI;
  ScalarFunction *this;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_fffffffffffffdd4;
  undefined4 in_stack_fffffffffffffddc;
  FunctionNullHandling in_stack_fffffffffffffde8;
  bind_lambda_function_t in_stack_fffffffffffffdf0;
  ScalarFunction *local_1f0;
  ScalarFunction *local_1e8;
  LogicalType local_1d8;
  vector<duckdb::LogicalType,_true> local_1c0;
  LogicalType local_1a8;
  _Any_data local_190;
  code *local_180;
  LogicalType local_170;
  ScalarFunction local_158;
  
  ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  LogicalType::Numeric();
  if (local_1f0 != local_1e8) {
    this = local_1f0;
    do {
      if (*(char *)&(this->super_BaseScalarFunction).super_SimpleFunction.super_Function.
                    _vptr_Function != '\x15') {
        LogicalType::LogicalType(&local_170,(LogicalType *)this);
        __l._M_len = 1;
        __l._M_array = &local_170;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_1c0,
                   __l,(allocator_type *)&stack0xfffffffffffffdf7);
        LogicalType::LogicalType(&local_1d8,TINYINT);
        ScalarFunction::GetScalarUnaryFunctionFixedReturn<signed_char,duckdb::SignOperator>
                  ((scalar_function_t *)&local_190,this,type);
        LogicalType::LogicalType(&local_1a8,INVALID);
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
        varargs._0_8_ = &local_1a8;
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
             in_stack_fffffffffffffdd4;
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 0;
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = in_stack_fffffffffffffddc;
        ScalarFunction::ScalarFunction
                  (&local_158,&local_1c0,&local_1d8,(scalar_function_t *)&local_190,
                   (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
                   (function_statistics_t)0x0,(init_local_state_t)0x0,varargs,CONSISTENT,
                   in_stack_fffffffffffffde8,in_stack_fffffffffffffdf0);
        ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
        emplace_back<duckdb::ScalarFunction>
                  (&(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
                    super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                   &local_158);
        local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             (_func_int **)&PTR__ScalarFunction_02433f30;
        if (local_158.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_158.function_info.internal.
                     super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_158.function.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_158.function.super__Function_base._M_manager)
                    ((_Any_data *)&local_158.function,(_Any_data *)&local_158.function,
                     __destroy_functor);
        }
        BaseScalarFunction::~BaseScalarFunction(&local_158.super_BaseScalarFunction);
        LogicalType::~LogicalType(&local_1a8);
        if (local_180 != (code *)0x0) {
          (*local_180)(&local_190,&local_190,__destroy_functor);
        }
        LogicalType::~LogicalType(&local_1d8);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_1c0);
        LogicalType::~LogicalType(&local_170);
      }
      this = (ScalarFunction *)
             &(this->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.field_2;
    } while (this != local_1e8);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_1f0);
  return in_RDI;
}

Assistant:

ScalarFunctionSet SignFun::GetFunctions() {
	ScalarFunctionSet sign;
	for (auto &type : LogicalType::Numeric()) {
		if (type.id() == LogicalTypeId::DECIMAL) {
			continue;
		} else {
			sign.AddFunction(
			    ScalarFunction({type}, LogicalType::TINYINT,
			                   ScalarFunction::GetScalarUnaryFunctionFixedReturn<int8_t, SignOperator>(type)));
		}
	}
	return sign;
}